

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

void __thiscall wabt::interp::Thread::PushValues(Thread *this,ValueTypes *types,Values *values)

{
  pointer *ppVVar1;
  pointer pTVar2;
  iterator __position;
  iterator __position_00;
  undefined8 uVar3;
  uint uVar4;
  pointer pTVar5;
  Value *__args;
  long lVar6;
  ulong uVar7;
  uint local_44;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<wabt::interp::Value,std::allocator<wabt::interp::Value>> *local_38;
  
  pTVar5 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pTVar2 - (long)pTVar5 >> 3 ==
      (long)(values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
            _M_impl.super__Vector_impl_data._M_start >> 4) {
    if (pTVar2 != pTVar5) {
      local_38 = (vector<wabt::interp::Value,std::allocator<wabt::interp::Value>> *)&this->values_;
      local_40 = &this->refs_;
      lVar6 = 0;
      uVar7 = 0;
      do {
        uVar4 = pTVar5[uVar7].enum_ + 0x17;
        if ((uVar4 < 8) && ((0xc5U >> (uVar4 & 0x1f) & 1) != 0)) {
          local_44 = (uint)((ulong)((long)(this->values_).
                                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->values_).
                                         super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4);
          __position._M_current =
               (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(local_40,__position,&local_44);
          }
          else {
            *__position._M_current = local_44;
            (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        __args = (Value *)((long)&((values->
                                   super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar6);
        __position_00._M_current =
             (this->values_).
             super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->values_).
            super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>::
          _M_realloc_insert<wabt::interp::Value_const&>(local_38,__position_00,__args);
        }
        else {
          uVar3 = *(undefined8 *)((long)&__args->field_0 + 8);
          ((__position_00._M_current)->field_0).i64_ = (__args->field_0).i64_;
          *(undefined8 *)((long)&(__position_00._M_current)->field_0 + 8) = uVar3;
          ppVVar1 = &(this->values_).
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + 1;
        }
        uVar7 = uVar7 + 1;
        pTVar5 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x10;
      } while (uVar7 < (ulong)((long)(types->
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 3))
      ;
    }
    return;
  }
  __assert_fail("types.size() == values.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                ,0x3fa,"void wabt::interp::Thread::PushValues(const ValueTypes &, const Values &)");
}

Assistant:

void Thread::PushValues(const ValueTypes& types, const Values& values) {
  assert(types.size() == values.size());
  for (size_t i = 0; i < types.size(); ++i) {
    if (IsReference(types[i])) {
      refs_.push_back(values_.size());
    }
    values_.push_back(values[i]);
  }
}